

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadable_extension_demo.cpp
# Opt level: O0

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
BoundedFunctionData::Copy(BoundedFunctionData *this)

{
  int32_t iVar1;
  pointer pBVar2;
  long in_RSI;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> in_RDI;
  templated_unique_single_t copy;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> this_00;
  
  this_00._M_head_impl = in_RDI._M_head_impl;
  duckdb::make_uniq<BoundedFunctionData>();
  iVar1 = *(int32_t *)(in_RSI + 8);
  pBVar2 = duckdb::unique_ptr<BoundedFunctionData,_std::default_delete<BoundedFunctionData>,_true>::
           operator->((unique_ptr<BoundedFunctionData,_std::default_delete<BoundedFunctionData>,_true>
                       *)this_00._M_head_impl);
  pBVar2->max_val = iVar1;
  duckdb::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
  unique_ptr<BoundedFunctionData,std::default_delete<std::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>>>,void>
            ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             this_00._M_head_impl,
             (unique_ptr<BoundedFunctionData,_std::default_delete<BoundedFunctionData>_> *)
             in_RDI._M_head_impl);
  duckdb::unique_ptr<BoundedFunctionData,_std::default_delete<BoundedFunctionData>,_true>::
  ~unique_ptr((unique_ptr<BoundedFunctionData,_std::default_delete<BoundedFunctionData>,_true> *)
              0x16c614);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
         this_00._M_head_impl;
}

Assistant:

unique_ptr<FunctionData> Copy() const override {
		auto copy = make_uniq<BoundedFunctionData>();
		copy->max_val = max_val;
		return std::move(copy);
	}